

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::CacheTestParam::generateTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined1 in_CL;
  ulong uVar1;
  string local_70;
  string local_50;
  
  getShaderFlagStr_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + 8),
             VK_SHADER_STAGE_VERTEX_BIT,(bool)in_CL);
  std::operator+(__return_storage_ptr__,"Create pipeline cache with ",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  for (uVar1 = 1; uVar1 < *(ulong *)((long)this + 0x20); uVar1 = (ulong)((int)uVar1 + 1)) {
    getShaderFlagStr_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + uVar1 * 4 + 8),
               VK_SHADER_STAGE_VERTEX_BIT,(bool)in_CL);
    std::operator+(&local_70,' ',&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string CacheTestParam::generateTestDescription (void) const
{
	std::string result("Create pipeline cache with " + getShaderFlagStr(m_shaders[0], true));

	for(deUint32 ndx = 1; ndx < m_shaderCount; ndx++)
		result += ' ' + getShaderFlagStr(m_shaders[ndx], true);

	return result;
}